

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::GetSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,SpectrumType spectrumType,
          Allocator alloc)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *param;
  size_t __n;
  pointer pSVar3;
  int iVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  long lVar6;
  bool bVar7;
  char cVar8;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar5 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar5 = paVar1;
  }
  bVar7 = sVar2 == 0;
  if (!bVar7) {
    lVar6 = 0;
    do {
      param = *(ParsedParameter **)((long)paVar5 + lVar6);
      __n = (param->name)._M_string_length;
      cVar8 = '\x03';
      if ((__n == name->_M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((param->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar4 == 0))))
      {
        extractSpectrumArray(__return_storage_ptr__,this,param,spectrumType,alloc);
        pSVar3 = (__return_storage_ptr__->
                 super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        cVar8 = pSVar3 != (__return_storage_ptr__->
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
        if (!(bool)cVar8 && pSVar3 != (pointer)0x0) {
          operator_delete(pSVar3,(long)(__return_storage_ptr__->
                                       super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pSVar3);
        }
      }
      if ((cVar8 != '\x03') && (cVar8 != '\0')) {
        if (!bVar7) {
          return __return_storage_ptr__;
        }
        break;
      }
      lVar6 = lVar6 + 8;
      bVar7 = sVar2 << 3 == lVar6;
    } while (!bVar7);
  }
  (__return_storage_ptr__->
  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::GetSpectrumArray(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty())
            return s;
    }
    return {};
}